

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_list.cpp
# Opt level: O3

PGList * duckdb_libpgquery::lcons(void *datum,PGList *list)

{
  PGListCell *pPVar1;
  PGListCell *new_head;
  
  pPVar1 = (PGListCell *)palloc(0x10);
  if (list == (PGList *)0x0) {
    pPVar1->next = (PGListCell *)0x0;
    list = (PGList *)palloc(0x18);
    list->type = T_PGList;
    list->length = 1;
    list->head = pPVar1;
    list->tail = pPVar1;
  }
  else {
    pPVar1->next = list->head;
    list->head = pPVar1;
    list->length = list->length + 1;
  }
  (pPVar1->data).ptr_value = datum;
  return list;
}

Assistant:

PGList *
lcons(void *datum, PGList *list)
{
	Assert(IsPointerList(list));

	if (list == NIL)
		list = new_list(T_PGList);
	else
		new_head_cell(list);

	lfirst(list->head) = datum;
	check_list_invariants(list);
	return list;
}